

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O3

int deal_info(char *info,PIPE *pipes)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  long lVar5;
  int i;
  int *piVar6;
  PIPE *pPVar7;
  long lVar8;
  char para [8];
  char value [16];
  char n [16];
  char head [8];
  char dest [16];
  char val [8];
  char getall_info [128];
  undefined4 local_10a8;
  char local_10a4;
  undefined2 uStack_10a3;
  PIPE *local_10a0;
  char local_1098 [16];
  char local_1088 [24];
  int *local_1070;
  long local_1068;
  int local_1060;
  char local_105c;
  char local_1058 [24];
  short local_1040 [4];
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  
  __isoc99_sscanf(info,"%[^_]_%[^_]_%s",&local_1060,&local_10a8,local_1098);
  if (local_105c == '\0' && local_1060 == 0x656d6147) {
    if (local_10a8 == 0x77656e) {
      iVar2 = atoi(local_1098);
      memset(&local_1038,0,0x1000);
      local_1038 = CONCAT35(local_1038._5_3_,0x3a6f666e69);
      get_rand_char((char *)&local_1038,pipes[iVar2].level);
      write(pipes[iVar2].pipe[1],&local_1038,0x100);
      iVar1 = 2;
      if (pipes[iVar2].index < 0x33) {
        iVar1 = pipes[iVar2].index + 1;
      }
      pipes[iVar2].index = iVar1;
    }
    else {
      local_10a0 = pipes;
      if (CONCAT22(uStack_10a3,CONCAT11(local_10a4,local_10a8._3_1_)) == 0x657461 &&
          local_10a8 == 0x61647075) {
        __isoc99_sscanf(local_1098,"%[^_]_%s",local_1088,local_1040);
        if (local_1040[0] == 0x73) {
          piVar6 = &pipes->index;
          lVar5 = 0x14;
LAB_00104287:
          if (*(_Bool *)(piVar6 + -0x38) != true) goto LAB_001042aa;
          iVar1 = strcmp(local_1088,(char *)((long)piVar6 + -0xdf));
          if (iVar1 != 0) goto LAB_001042aa;
          piVar6[(long)*piVar6 + -0x32] = piVar6[(long)*piVar6 + -0x32] + piVar6[-0x33] * 200;
          memcpy(&local_1038,"update_",0x100);
          sprintf(local_1058,"%d",(ulong)(uint)piVar6[(long)*piVar6 + -0x32]);
          strcat((char *)&local_1038,(char *)((long)piVar6 + -0xdf));
          sVar3 = strlen((char *)&local_1038);
          *(undefined2 *)((long)&local_1038 + sVar3) = 0x5f;
          strcat((char *)&local_1038,local_1058);
          lVar5 = 8;
          do {
            if (*(char *)((long)pipes->pipe + lVar5) == '\x01') {
              iVar1 = *(int *)((long)local_10a0->pipe + lVar5 + -4);
              sVar3 = strlen((char *)&local_1038);
              pipes = local_10a0;
              sVar4 = write(iVar1,&local_1038,sVar3);
              if (sVar4 == -1) {
                puts("Pipe is broken!");
              }
            }
            lVar5 = lVar5 + 0xec;
          } while (lVar5 != 0x1278);
        }
      }
      else if (local_10a4 == '\0' && local_10a8 == 0x74616863) {
        memset(&local_1038,0,0x100);
        local_1038 = CONCAT35(local_1038._5_3_,0x5f74616863);
        strcat((char *)&local_1038,local_1098);
        lVar5 = 8;
        do {
          if (*(char *)((long)pipes->pipe + lVar5) == '\x01') {
            iVar1 = *(int *)((long)local_10a0->pipe + lVar5 + -4);
            sVar3 = strlen((char *)&local_1038);
            pipes = local_10a0;
            sVar4 = write(iVar1,&local_1038,sVar3);
            if (sVar4 == -1) {
              puts("Pipe is broken!");
            }
          }
          lVar5 = lVar5 + 0xec;
        } while (lVar5 != 0x1278);
      }
      else if (local_10a8 == 0x746567) {
        uStack_1030 = 0;
        local_fc8 = 0;
        uStack_fc0 = 0;
        local_fd8 = 0;
        uStack_fd0 = 0;
        local_fe8 = 0;
        uStack_fe0 = 0;
        local_ff8 = 0;
        uStack_ff0 = 0;
        local_1008 = 0;
        uStack_1000 = 0;
        local_1018 = 0;
        uStack_1010 = 0;
        local_1028 = 0;
        uStack_1020 = 0;
        local_1038 = 0x5f746567;
        lVar5 = 0;
        __isoc99_sscanf(local_1098,"%[^_]%s",local_1088,local_1058);
        do {
          iVar1 = strcmp(pipes[lVar5].name,local_1088);
          pPVar7 = pipes;
          if (iVar1 == 0) {
            lVar8 = 9;
            do {
              iVar1 = strcmp((char *)((long)pPVar7->pipe + lVar8),local_1058);
              if (iVar1 == 0) {
                iVar1 = pipes[lVar5].pipe[1];
                sVar3 = strlen((char *)&local_1038);
                pPVar7 = local_10a0;
                sVar4 = write(iVar1,&local_1038,sVar3);
                if (sVar4 != -1) break;
                puts("Pipe is broken!");
              }
              lVar8 = lVar8 + 0xec;
            } while (lVar8 != 0x1279);
          }
          lVar5 = lVar5 + 1;
          pipes = pPVar7;
        } while (lVar5 != 0x14);
      }
      else {
        if (CONCAT22(uStack_10a3,CONCAT11(local_10a4,local_10a8._3_1_)) != 0x6c6c61 ||
            local_10a8 != 0x61746567) {
          return 1;
        }
        local_1070 = &pipes->index;
        lVar5 = 0;
        do {
          local_1068 = lVar5;
          iVar1 = strcmp(local_10a0[lVar5].name,local_1098);
          pPVar7 = local_10a0;
          if (iVar1 == 0) {
            lVar8 = 0x14;
            piVar6 = local_1070;
            do {
              uStack_1030 = 0;
              local_fc8 = 0;
              uStack_fc0 = 0;
              local_fd8 = 0;
              uStack_fd0 = 0;
              local_fe8 = 0;
              uStack_fe0 = 0;
              local_ff8 = 0;
              uStack_ff0 = 0;
              local_1008 = 0;
              uStack_1000 = 0;
              local_1018 = 0;
              uStack_1010 = 0;
              local_1028 = 0;
              uStack_1020 = 0;
              local_1038 = 0x5f6c6c61746567;
              sVar3 = strlen((char *)&local_1038);
              *(undefined2 *)((long)&local_1038 + sVar3) = 0x5f;
              strcat((char *)&local_1038,(char *)((long)piVar6 + -0xdf));
              sVar3 = strlen((char *)&local_1038);
              *(undefined2 *)((long)&local_1038 + sVar3) = 0x5f;
              sprintf(local_1088,"%d",(ulong)(uint)piVar6[(long)*piVar6 + -0x32]);
              iVar1 = pPVar7[lVar5].pipe[1];
              sVar3 = strlen((char *)&local_1038);
              sVar4 = write(iVar1,&local_1038,sVar3);
              if (sVar4 == -1) {
                puts("Pipe is broken!");
              }
              piVar6 = piVar6 + 0x3b;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar5 = local_1068 + 1;
        } while (lVar5 != 0x14);
      }
    }
LAB_001044e9:
    iVar1 = 1;
  }
  else {
    printf("Info head is wrong:%s!\n",&local_1060);
    iVar1 = -1;
  }
  return iVar1;
LAB_001042aa:
  piVar6 = piVar6 + 0x3b;
  lVar5 = lVar5 + -1;
  if (lVar5 == 0) goto LAB_001044e9;
  goto LAB_00104287;
}

Assistant:

int deal_info(char *info, struct PIPE *pipes){
    char head[8];
    char para[8];
    char value[16];
    int new_n = 0;
    sscanf(info, "%[^_]_%[^_]_%s", head, para, value);
    if(strcmp(head, "Game") != 0){
        printf("Info head is wrong:%s!\n", head);
        return -1;
    }
    if(strcmp(para, "new") == 0){
        new_n = atoi(value);
        char buf[MSG_MAX_SIZE]= "info:";
        get_rand_char(buf, pipes[new_n].level);
        write(pipes[new_n].pipe[1],buf, 256);
        if(pipes[new_n].index > MAX_SONG)
            pipes[new_n].index = 1;
        pipes[new_n].index++;
    } else if(strcmp(para, "update") == 0){
        char user[16];
        char val[8];
        sscanf(value, "%[^_]_%s", user, val);
        if(strcmp(val, "s") == 0){
            for(int i = 0; i < MAX_USER; i++){
                if(pipes[i].useState && strcmp(user, pipes[i].name) == 0){
                    pipes[i].score[pipes[i].index] += PER_SORCE * pipes[i].level;
                    char update_info[256] = "update_";
                    char b[16];
                    sprintf(b, "%d", pipes[i].score[pipes[i].index]);
                    strcat(update_info, pipes[i].name);
                    strcat(update_info, "_");
                    strcat(update_info, b);
                    for(int j = 0; j < MAX_USER; j++){
                        if(pipes[j].useState == true){
                            if(write(pipes[j].pipe[1], update_info, strlen(update_info)) == -1){
                                printf("Pipe is broken!\n");
                                continue;
                            }
                        }
                    }
                    break;
                }
            }

        }
    } else if(strcmp(para, "chat") == 0){
        char chat_info[256] = "chat_";
        strcat(chat_info, value);
        for(int j = 0; j < MAX_USER; j++){
            if(pipes[j].useState == true) {
                if (write(pipes[j].pipe[1], chat_info, strlen(chat_info)) == -1) {
                    printf("Pipe is broken!\n");
                    continue;
                }
            }
        }
    } else if(strcmp(para, "get") == 0){
        char get_info[128] = "get_";
        char src[16];
        char dest[16];
        sscanf(value, "%[^_]%s", src, dest);
        for(int i = 0; i < MAX_USER; i++){
            if(strcmp(pipes[i].name, src) == 0){
                for (int j = 0; j < MAX_USER ; ++j) {
                    if(strcmp(pipes[j].name, dest) == 0){
                        if(write(pipes[i].pipe[1], get_info, strlen(get_info)) == -1){
                            printf("Pipe is broken!\n");
                            continue;
                        }
                        break;
                    }
                }
            }
        }
    } else if(strcmp(para, "getall") == 0){
        char getall_info[128];
        char n[16];
        for(int i = 0; i < MAX_USER; i++) {
            if (strcmp(pipes[i].name, value) == 0) {
                for (int j = 0; j < MAX_USER ; ++j) {
                    memset(getall_info, 0, 128);
                    strcpy(getall_info, "getall_");
                    strcat(getall_info, "_");
                    strcat(getall_info, pipes[j].name);
                    strcat(getall_info, "_");
                    sprintf(n, "%d", pipes[j].score[pipes[j].index]);
                    if(write(pipes[i].pipe[1], getall_info, strlen(getall_info)) == -1){
                        printf("Pipe is broken!\n");
                        continue;
                    }
                }
            }
        }
    }
    return 1;
}